

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

OpCode __thiscall
ByteCodeGenerator::GetInitFldOp
          (ByteCodeGenerator *this,Scope *scope,RegSlot scopeLocation,FuncInfo *funcInfo,
          bool letDecl)

{
  bool bVar1;
  OpCode local_2c;
  OpCode op;
  bool letDecl_local;
  FuncInfo *funcInfo_local;
  RegSlot scopeLocation_local;
  Scope *scope_local;
  ByteCodeGenerator *this_local;
  
  if ((scopeLocation == 0xffffffff) || (scopeLocation != funcInfo->frameObjRegister)) {
    bVar1 = Scope::HasInnerScopeIndex(scope);
    if (bVar1) {
      local_2c = InitInnerFld;
      if (letDecl) {
        local_2c = InitInnerLetFld;
      }
    }
    else {
      local_2c = InitFld;
      if (letDecl) {
        local_2c = InitLetFld;
      }
    }
  }
  else {
    local_2c = InitLocalFld;
    if (letDecl) {
      local_2c = InitLocalLetFld;
    }
  }
  return local_2c;
}

Assistant:

Js::OpCode
ByteCodeGenerator::GetInitFldOp(Scope *scope, Js::RegSlot scopeLocation, FuncInfo *funcInfo, bool letDecl)
{
    Js::OpCode op;

    if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameObjRegister)
    {
        op = letDecl ? Js::OpCode::InitLocalLetFld : Js::OpCode::InitLocalFld;
    }
    else if (scope->HasInnerScopeIndex())
    {
        op = letDecl ? Js::OpCode::InitInnerLetFld : Js::OpCode::InitInnerFld;
    }
    else
    {
        op = letDecl ? Js::OpCode::InitLetFld : Js::OpCode::InitFld;
    }

    return op;
}